

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::ctor<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::AuthenticatedStream>
               (ImmediatePromiseNode<kj::AuthenticatedStream> *location,AuthenticatedStream *params)

{
  ExceptionOr<kj::AuthenticatedStream> local_1d0;
  
  _::ExceptionOr<kj::AuthenticatedStream>::ExceptionOr(&local_1d0,params);
  _::ImmediatePromiseNode<kj::AuthenticatedStream>::ImmediatePromiseNode(location,&local_1d0);
  _::ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_1d0);
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}